

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,string *message)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  ExceptionType EVar2;
  pointer this_01;
  mapped_type *pmVar3;
  char *__rhs;
  __node_base *p_Var4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  info;
  string local_a8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  string local_50;
  
  this->initialized = true;
  this->type = INVALID;
  (this->raw_message)._M_dataplus._M_p = (pointer)&(this->raw_message).field_2;
  (this->raw_message)._M_string_length = 0;
  this_00 = &this->raw_message;
  (this->raw_message).field_2._M_local_buf[0] = '\0';
  (this->final_message)._M_dataplus._M_p = (pointer)&(this->final_message).field_2;
  (this->final_message)._M_string_length = 0;
  (this->final_message).field_2._M_local_buf[0] = '\0';
  (this->extra_info)._M_h._M_buckets = &(this->extra_info)._M_h._M_single_bucket;
  (this->extra_info)._M_h._M_bucket_count = 1;
  (this->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_info)._M_h._M_element_count = 0;
  (this->extra_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((message->_M_string_length == 0) || (*(message->_M_dataplus)._M_p != '{')) {
    local_88._M_h._M_buckets = (__buckets_ptr)rmdir;
    __rhs = (char *)::std::bad_alloc::what();
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              message,__rhs);
    ::std::bad_alloc::~bad_alloc((bad_alloc *)&local_88);
    if (bVar1) {
      this->type = OUT_OF_MEMORY;
      ::std::__cxx11::string::assign((char *)this_00);
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)this_00);
    }
  }
  else {
    StringUtil::ParseJSONMap((StringUtil *)&local_a8,message,false);
    this_01 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
              operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          *)&local_a8);
    ComplexJSON::Flatten_abi_cxx11_(&local_88,this_01);
    ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
              ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
               &local_a8);
    p_Var4 = &local_88._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1);
      bVar1 = ::std::operator==(__lhs,"exception_type");
      if (bVar1) {
        EVar2 = Exception::StringToExceptionType((string *)(p_Var4 + 5));
        this->type = EVar2;
      }
      else {
        bVar1 = ::std::operator==(__lhs,"exception_message");
        if (bVar1) {
          ::std::__cxx11::string::string((string *)&local_50,(string *)(p_Var4 + 5));
          SanitizeErrorMessage(&local_a8,&local_50);
          ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
          ::std::__cxx11::string::~string((string *)&local_a8);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          pmVar3 = ::std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->extra_info,__lhs);
          ::std::__cxx11::string::_M_assign((string *)pmVar3);
        }
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_88);
  }
  ConstructFinalMessage_abi_cxx11_((string *)&local_88,this);
  ::std::__cxx11::string::operator=((string *)&this->final_message,(string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

ErrorData::ErrorData(const string &message)
    : initialized(true), type(ExceptionType::INVALID), raw_message(string()), final_message(string()) {

	// parse the constructed JSON
	if (message.empty() || message[0] != '{') {
		// not JSON! Use the message as a raw Exception message and leave type as uninitialized

		if (message == std::bad_alloc().what()) {
			type = ExceptionType::OUT_OF_MEMORY;
			raw_message = "Allocation failure";
		} else {
			raw_message = message;
		}
	} else {
		auto info = StringUtil::ParseJSONMap(message)->Flatten();
		for (auto &entry : info) {
			if (entry.first == "exception_type") {
				type = Exception::StringToExceptionType(entry.second);
			} else if (entry.first == "exception_message") {
				raw_message = SanitizeErrorMessage(entry.second);
			} else {
				extra_info[entry.first] = entry.second;
			}
		}
	}

	final_message = ConstructFinalMessage();
}